

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O0

int mriStep_CheckCoupling(ARKodeMem ark_mem)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  ARKodeMem in_RDI;
  sunrealtype tol;
  sunrealtype Wabs;
  sunrealtype Gabs;
  ARKodeMRIStepMem step_mem;
  int okay;
  int k;
  int j;
  int i;
  double local_38;
  double local_30;
  int local_1c;
  int local_18;
  int local_14;
  int local_4;
  
  if (in_RDI->step_mem == (void *)0x0) {
    arkProcessError(in_RDI,-0x15,0x72d,"mriStep_CheckCoupling",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                    ,"Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    pvVar1 = in_RDI->step_mem;
    if (*(int *)(*(long *)((long)pvVar1 + 0x38) + 4) < 1) {
      arkProcessError(in_RDI,-0x29,0x736,"mriStep_CheckCoupling",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                      ,"stages < 1!");
      local_4 = -0x29;
    }
    else if (*(int *)(*(long *)((long)pvVar1 + 0x38) + 8) < 1) {
      arkProcessError(in_RDI,-0x29,0x73e,"mriStep_CheckCoupling",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                      ,"method order < 1");
      local_4 = -0x29;
    }
    else if ((*(int *)(*(long *)((long)pvVar1 + 0x38) + 0xc) < 1) && (in_RDI->fixedstep == 0)) {
      arkProcessError(in_RDI,-0x29,0x746,"mriStep_CheckCoupling",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                      ,"embedding order < 1");
      local_4 = -0x29;
    }
    else {
      if ((*(int *)((long)pvVar1 + 0x1c) == 0) || (*(int *)((long)pvVar1 + 0x18) == 0)) {
        if (*(int *)((long)pvVar1 + 0x18) == 0) {
          if ((*(long *)(*(long *)((long)pvVar1 + 0x38) + 0x18) != 0) ||
             (*(long *)(*(long *)((long)pvVar1 + 0x38) + 0x20) == 0)) {
            arkProcessError(in_RDI,-0x16,0x765,"mriStep_CheckCoupling",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                            ,"Invalid coupling table fro an implicit problem!");
            return -0x16;
          }
        }
        else if ((*(long *)(*(long *)((long)pvVar1 + 0x38) + 0x18) == 0) ||
                (*(long *)(*(long *)((long)pvVar1 + 0x38) + 0x20) != 0)) {
          arkProcessError(in_RDI,-0x16,0x75b,"mriStep_CheckCoupling",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                          ,"Invalid coupling table for an explicit problem!");
          return -0x16;
        }
      }
      else if ((*(long *)(*(long *)((long)pvVar1 + 0x38) + 0x18) == 0) ||
              (*(long *)(*(long *)((long)pvVar1 + 0x38) + 0x20) == 0)) {
        arkProcessError(in_RDI,-0x16,0x751,"mriStep_CheckCoupling",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                        ,"Invalid coupling table for an IMEX problem!");
        return -0x16;
      }
      if (*(long *)(*(long *)((long)pvVar1 + 0x38) + 0x18) != 0) {
        local_38 = 0.0;
        for (local_1c = 0; local_1c < **(int **)((long)pvVar1 + 0x38); local_1c = local_1c + 1) {
          for (local_14 = 0; local_14 < *(int *)(*(long *)((long)pvVar1 + 0x38) + 4);
              local_14 = local_14 + 1) {
            for (local_18 = local_14; local_18 < *(int *)(*(long *)((long)pvVar1 + 0x38) + 4);
                local_18 = local_18 + 1) {
              local_38 = ABS(*(double *)
                              (*(long *)(*(long *)(*(long *)(*(long *)((long)pvVar1 + 0x38) + 0x18)
                                                  + (long)local_1c * 8) + (long)local_14 * 8) +
                              (long)local_18 * 8)) + local_38;
            }
          }
        }
        if (2.220446049250313e-14 < local_38) {
          arkProcessError(in_RDI,-0x29,0x77b,"mriStep_CheckCoupling",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                          ,"Coupling can be up to ERK (at most)!");
          return -0x29;
        }
      }
      if (*(long *)(*(long *)((long)pvVar1 + 0x38) + 0x20) != 0) {
        local_30 = 0.0;
        for (local_1c = 0; local_1c < **(int **)((long)pvVar1 + 0x38); local_1c = local_1c + 1) {
          for (local_14 = 0; local_18 = local_14,
              local_14 < *(int *)(*(long *)((long)pvVar1 + 0x38) + 4); local_14 = local_14 + 1) {
            while (local_18 = local_18 + 1, local_18 < *(int *)(*(long *)((long)pvVar1 + 0x38) + 4))
            {
              local_30 = ABS(*(double *)
                              (*(long *)(*(long *)(*(long *)(*(long *)((long)pvVar1 + 0x38) + 0x20)
                                                  + (long)local_1c * 8) + (long)local_14 * 8) +
                              (long)local_18 * 8)) + local_30;
            }
          }
        }
        if (2.220446049250313e-14 < local_30) {
          arkProcessError(in_RDI,-0x29,0x791,"mriStep_CheckCoupling",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                          ,"Coupling can be up to DIRK (at most)!");
          return -0x29;
        }
      }
      bVar2 = true;
      for (local_14 = 0; local_14 < *(int *)(*(long *)((long)pvVar1 + 0x38) + 4);
          local_14 = local_14 + 1) {
        iVar3 = mriStepCoupling_GetStageType(*(MRIStepCoupling *)((long)pvVar1 + 0x38),local_14);
        if (iVar3 == 3) {
          bVar2 = false;
        }
      }
      if (bVar2) {
        bVar2 = true;
        for (local_14 = 1; local_14 < *(int *)(*(long *)((long)pvVar1 + 0x38) + 4);
            local_14 = local_14 + 1) {
          if (*(double *)(*(long *)(*(long *)((long)pvVar1 + 0x38) + 0x10) + (long)local_14 * 8) -
              *(double *)
               (*(long *)(*(long *)((long)pvVar1 + 0x38) + 0x10) + (long)(local_14 + -1) * 8) <
              -2.220446049250313e-14) {
            bVar2 = false;
          }
        }
        if (bVar2) {
          local_30 = ABS(**(double **)(*(long *)((long)pvVar1 + 0x38) + 0x10));
          for (local_1c = 0; local_1c < **(int **)((long)pvVar1 + 0x38); local_1c = local_1c + 1) {
            for (local_18 = 0; local_18 < *(int *)(*(long *)((long)pvVar1 + 0x38) + 4);
                local_18 = local_18 + 1) {
              if (*(long *)(*(long *)((long)pvVar1 + 0x38) + 0x18) != 0) {
                local_30 = ABS(*(double *)
                                (**(long **)(*(long *)(*(long *)((long)pvVar1 + 0x38) + 0x18) +
                                            (long)local_1c * 8) + (long)local_18 * 8)) + local_30;
              }
              if (*(long *)(*(long *)((long)pvVar1 + 0x38) + 0x20) != 0) {
                local_30 = ABS(*(double *)
                                (**(long **)(*(long *)(*(long *)((long)pvVar1 + 0x38) + 0x20) +
                                            (long)local_1c * 8) + (long)local_18 * 8)) + local_30;
              }
            }
          }
          if (local_30 <= 2.220446049250313e-14) {
            if (ABS(1.0 - *(double *)
                           (*(long *)(*(long *)((long)pvVar1 + 0x38) + 0x10) +
                           (long)(*(int *)(*(long *)((long)pvVar1 + 0x38) + 4) + -1) * 8)) <=
                2.220446049250313e-14) {
              local_4 = 0;
            }
            else {
              arkProcessError(in_RDI,-0x29,0x7cb,"mriStep_CheckCoupling",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                              ,"Final stage time must be equal 1.");
              local_4 = -0x29;
            }
          }
          else {
            arkProcessError(in_RDI,-0x29,0x7c3,"mriStep_CheckCoupling",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                            ,"First stage must equal old solution.");
            local_4 = -0x29;
          }
        }
        else {
          arkProcessError(in_RDI,-0x29,0x7b2,"mriStep_CheckCoupling",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                          ,"Stage times must be sorted.");
          local_4 = -0x29;
        }
      }
      else {
        arkProcessError(in_RDI,-0x29,0x7a2,"mriStep_CheckCoupling",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_mristep.c"
                        ,"solve-coupled DIRK stages not currently supported");
        local_4 = -0x29;
      }
    }
  }
  return local_4;
}

Assistant:

int mriStep_CheckCoupling(ARKodeMem ark_mem)
{
  int i, j, k;
  sunbooleantype okay;
  ARKodeMRIStepMem step_mem;
  sunrealtype Gabs, Wabs;
  const sunrealtype tol = SUN_RCONST(100.0) * SUN_UNIT_ROUNDOFF;

  /* access ARKodeMRIStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_MRISTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeMRIStepMem)ark_mem->step_mem;

  /* check that stages > 0 */
  if (step_mem->MRIC->stages < 1)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "stages < 1!");
    return (ARK_INVALID_TABLE);
  }

  /* check that method order q > 0 */
  if (step_mem->MRIC->q < 1)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "method order < 1");
    return (ARK_INVALID_TABLE);
  }

  /* check that embedding order p > 0 (if adaptive) */
  if ((step_mem->MRIC->p < 1) && (!ark_mem->fixedstep))
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "embedding order < 1");
    return (ARK_INVALID_TABLE);
  }

  /* Check that the matrices are defined appropriately */
  if (step_mem->implicit_rhs && step_mem->explicit_rhs)
  {
    /* ImEx */
    if (!(step_mem->MRIC->W) || !(step_mem->MRIC->G))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Invalid coupling table for an IMEX problem!");
      return (ARK_ILL_INPUT);
    }
  }
  else if (step_mem->explicit_rhs)
  {
    /* Explicit */
    if (!(step_mem->MRIC->W) || step_mem->MRIC->G)
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Invalid coupling table for an explicit problem!");
      return (ARK_ILL_INPUT);
    }
  }
  else
  {
    /* Implicit */
    if (step_mem->MRIC->W || !(step_mem->MRIC->G))
    {
      arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Invalid coupling table fro an implicit problem!");
      return (ARK_ILL_INPUT);
    }
  }

  /* Check that W tables are strictly lower triangular */
  if (step_mem->MRIC->W)
  {
    Wabs = SUN_RCONST(0.0);
    for (k = 0; k < step_mem->MRIC->nmat; k++)
    {
      for (i = 0; i < step_mem->MRIC->stages; i++)
      {
        for (j = i; j < step_mem->MRIC->stages; j++)
        {
          Wabs += SUNRabs(step_mem->MRIC->W[k][i][j]);
        }
      }
    }
    if (Wabs > tol)
    {
      arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                      "Coupling can be up to ERK (at most)!");
      return (ARK_INVALID_TABLE);
    }
  }

  /* Check that G tables are lower triangular */
  if (step_mem->MRIC->G)
  {
    Gabs = SUN_RCONST(0.0);
    for (k = 0; k < step_mem->MRIC->nmat; k++)
    {
      for (i = 0; i < step_mem->MRIC->stages; i++)
      {
        for (j = i + 1; j < step_mem->MRIC->stages; j++)
        {
          Gabs += SUNRabs(step_mem->MRIC->G[k][i][j]);
        }
      }
    }
    if (Gabs > tol)
    {
      arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                      "Coupling can be up to DIRK (at most)!");
      return (ARK_INVALID_TABLE);
    }
  }

  /* Check that no stage has MRISTAGE_DIRK_FAST type (for now) */
  okay = SUNTRUE;
  for (i = 0; i < step_mem->MRIC->stages; i++)
  {
    if (mriStepCoupling_GetStageType(step_mem->MRIC, i) == MRISTAGE_DIRK_FAST)
    {
      okay = SUNFALSE;
    }
  }
  if (!okay)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "solve-coupled DIRK stages not currently supported");
    return (ARK_INVALID_TABLE);
  }

  /* check that stage times are sorted */
  okay = SUNTRUE;
  for (i = 1; i < step_mem->MRIC->stages; i++)
  {
    if ((step_mem->MRIC->c[i] - step_mem->MRIC->c[i - 1]) < -tol)
    {
      okay = SUNFALSE;
    }
  }
  if (!okay)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "Stage times must be sorted.");
    return (ARK_INVALID_TABLE);
  }

  /* check that the first stage is just the old step solution */
  Gabs = SUNRabs(step_mem->MRIC->c[0]);
  for (k = 0; k < step_mem->MRIC->nmat; k++)
  {
    for (j = 0; j < step_mem->MRIC->stages; j++)
    {
      if (step_mem->MRIC->W) { Gabs += SUNRabs(step_mem->MRIC->W[k][0][j]); }
      if (step_mem->MRIC->G) { Gabs += SUNRabs(step_mem->MRIC->G[k][0][j]); }
    }
  }
  if (Gabs > tol)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "First stage must equal old solution.");
    return (ARK_INVALID_TABLE);
  }

  /* check that the last stage is at the final time */
  if (SUNRabs(ONE - step_mem->MRIC->c[step_mem->MRIC->stages - 1]) > tol)
  {
    arkProcessError(ark_mem, ARK_INVALID_TABLE, __LINE__, __func__, __FILE__,
                    "Final stage time must be equal 1.");
    return (ARK_INVALID_TABLE);
  }

  return (ARK_SUCCESS);
}